

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cc
# Opt level: O2

int __thiscall flow::Program::link(Program *this,char *__from,char *__to)

{
  pointer ppVar1;
  pointer ppNVar2;
  Program *pPVar3;
  byte bVar4;
  NativeCallback *pNVar5;
  NativeCallback *pNVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *signature;
  pointer signature_00;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *module;
  pointer ppVar7;
  long lVar8;
  allocator<char> local_b9;
  NativeCallback *local_b8;
  vector<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_> *local_b0;
  NativeCallback *local_a8;
  Report *local_a0;
  Program *local_98;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this->runtime_ = (Runtime *)__from;
  ppVar1 = (this->cp_).modules_.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pNVar5 = (NativeCallback *)0x0;
  local_a0 = (Report *)__to;
  for (ppVar7 = (this->cp_).modules_.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar7 != ppVar1; ppVar7 = ppVar7 + 1) {
    bVar4 = (**(code **)(*(long *)__from + 0x10))(__from,ppVar7,&ppVar7->second,0);
    pNVar5 = (NativeCallback *)(ulong)((int)pNVar5 + (uint)(bVar4 ^ 1));
  }
  local_b0 = &this->nativeHandlers_;
  local_b8 = pNVar5;
  std::vector<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_>::resize
            (local_b0,(long)(this->cp_).nativeHandlerSignatures_.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->cp_).nativeHandlerSignatures_.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5);
  local_a8 = (NativeCallback *)
             (this->cp_).nativeHandlerSignatures_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  lVar8 = 0;
  local_98 = this;
  for (signature_00 = (this->cp_).nativeHandlerSignatures_.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; pPVar3 = local_98,
      (NativeCallback *)signature_00 != local_a8; signature_00 = signature_00 + 1) {
    pNVar5 = Runtime::find((Runtime *)__from,signature_00);
    ppNVar2 = (local_b0->
              super__Vector_base<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if (pNVar5 == (NativeCallback *)0x0) {
      *(undefined8 *)((long)ppNVar2 + lVar8) = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"Unresolved symbol to native handler signature: {}",&local_b9);
      std::__cxx11::string::string((string *)&local_50,(string *)signature_00);
      diagnostics::Report::linkError<std::__cxx11::string>(local_a0,&local_90,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_90);
      local_b8 = (NativeCallback *)(ulong)((int)local_b8 + 1);
    }
    else {
      *(NativeCallback **)((long)ppNVar2 + lVar8) = pNVar5;
    }
    lVar8 = lVar8 + 8;
  }
  local_b0 = &local_98->nativeFunctions_;
  std::vector<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_>::resize
            (local_b0,(long)(local_98->cp_).nativeFunctionSignatures_.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_98->cp_).nativeFunctionSignatures_.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5);
  pNVar6 = (NativeCallback *)
           (pPVar3->cp_).nativeFunctionSignatures_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar8 = 0;
  local_a8 = pNVar6;
  for (pNVar5 = (NativeCallback *)
                (pPVar3->cp_).nativeFunctionSignatures_.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pNVar5 != local_a8;
      pNVar5 = (NativeCallback *)&(pNVar5->verifier_).super__Function_base._M_manager) {
    pNVar6 = Runtime::find((Runtime *)__from,(string *)pNVar5);
    ppNVar2 = (local_b0->
              super__Vector_base<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if (pNVar6 == (NativeCallback *)0x0) {
      *(undefined8 *)((long)ppNVar2 + lVar8) = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"Unresolved native function signature: {}",&local_b9);
      std::__cxx11::string::string((string *)&local_70,(string *)pNVar5);
      diagnostics::Report::linkError<std::__cxx11::string>(local_a0,&local_90,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      pNVar6 = (NativeCallback *)(ulong)((int)local_b8 + 1);
      local_b8 = pNVar6;
    }
    else {
      *(NativeCallback **)((long)ppNVar2 + lVar8) = pNVar6;
    }
    lVar8 = lVar8 + 8;
  }
  return (int)CONCAT71((int7)((ulong)pNVar6 >> 8),(int)local_b8 == 0);
}

Assistant:

bool Program::link(Runtime* runtime, diagnostics::Report* report) {
  runtime_ = runtime;
  int errors = 0;

  // load runtime modules
  for (const auto& module : cp_.getModules()) {
    if (!runtime->import(module.first, module.second, nullptr)) {
      errors++;
    }
  }

  // link nattive handlers
  nativeHandlers_.resize(cp_.getNativeHandlerSignatures().size());
  size_t i = 0;
  for (const auto& signature : cp_.getNativeHandlerSignatures()) {
    // map to nativeHandlers_[i]
    if (NativeCallback* cb = runtime->find(signature)) {
      nativeHandlers_[i] = cb;
    } else {
      nativeHandlers_[i] = nullptr;
      report->linkError("Unresolved symbol to native handler signature: {}", signature);
      // TODO unresolvedSymbols_.push_back(signature);
      errors++;
    }
    ++i;
  }

  // link nattive functions
  nativeFunctions_.resize(cp_.getNativeFunctionSignatures().size());
  i = 0;
  for (const auto& signature : cp_.getNativeFunctionSignatures()) {
    if (NativeCallback* cb = runtime->find(signature)) {
      nativeFunctions_[i] = cb;
    } else {
      nativeFunctions_[i] = nullptr;
      report->linkError("Unresolved native function signature: {}", signature);
      errors++;
    }
    ++i;
  }

  return errors == 0;
}